

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void cmovno_(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UIntPtr UVar4;
  ulong uVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  uint uVar12;
  
  UVar3 = (pMyDisasm->Reserved_).VEX.state;
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if (UVar3 == '\x01') {
LAB_0011c50c:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
  }
  else if (UVar3 == '\x01') {
    if (((pMyDisasm->Reserved_).VEX.L == '\x01') && (((pMyDisasm->Reserved_).VEX.vvvv & 8) != 0)) {
      UVar4 = (pMyDisasm->Reserved_).EIP_;
      uVar5 = (pMyDisasm->Reserved_).EndOfBlock;
      if (uVar5 < UVar4 + 2 && uVar5 != 0) {
        (pMyDisasm->Reserved_).OutOfBlock = 1;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
        return;
      }
      uVar12 = (uint)(*(byte *)(UVar4 + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar12;
      if (uVar12 == 3) {
        UVar3 = (pMyDisasm->Reserved_).VEX.pp;
        if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
          if (UVar3 == '\0') {
            (pMyDisasm->Instruction).Category = 0x140000;
            builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kandw",6);
          }
          else {
            if (UVar3 != '\x01') goto LAB_0011c50c;
            (pMyDisasm->Instruction).Category = 0x140000;
            builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kandb",6);
          }
        }
        else if (UVar3 == '\0') {
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kandq",6);
        }
        else {
          if (UVar3 != '\x01') goto LAB_0011c50c;
          (pMyDisasm->Instruction).Category = 0x140000;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"kandd",6);
        }
        (pMyDisasm->Reserved_).Register_ = 0x400;
        GyEy(pMyDisasm);
        return;
      }
    }
    goto LAB_0011c50c;
  }
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"cmovno",7);
  GvEv(pMyDisasm);
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x13].SF_;
  UVar6 = EFLAGS_TABLE[0x13].ZF_;
  UVar7 = EFLAGS_TABLE[0x13].AF_;
  UVar8 = EFLAGS_TABLE[0x13].PF_;
  UVar9 = EFLAGS_TABLE[0x13].CF_;
  UVar10 = EFLAGS_TABLE[0x13].TF_;
  UVar11 = EFLAGS_TABLE[0x13].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x13].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
  (pMyDisasm->Instruction).Flags.AF_ = UVar7;
  (pMyDisasm->Instruction).Flags.PF_ = UVar8;
  (pMyDisasm->Instruction).Flags.CF_ = UVar9;
  (pMyDisasm->Instruction).Flags.TF_ = UVar10;
  (pMyDisasm->Instruction).Flags.IF_ = UVar11;
  UVar3 = EFLAGS_TABLE[0x13].NT_;
  UVar6 = EFLAGS_TABLE[0x13].RF_;
  UVar7 = EFLAGS_TABLE[0x13].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x13].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar6;
  (pMyDisasm->Instruction).Flags.alignment = UVar7;
  return;
}

Assistant:

void __bea_callspec__ cmovno_(PDISASM pMyDisasm)
{

  if (
      (GV.EVEX.state != InUsePrefix) &&
      (GV.VEX.state == InUsePrefix) &&
      (GV.VEX.L == 1) &&
      (((GV.VEX.vvvv >> 3) & 0x1) == 1)
    ) {
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if (GV.MOD_ == 0x3) {
      if (GV.REX.W_ == 0) {
        if (GV.VEX.pp == 1) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandb");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else if (GV.VEX.pp == 0) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandw");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else {
        if (GV.VEX.pp == 1) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandd");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else if (GV.VEX.pp == 0) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandq");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state != InUsePrefix){
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cmovno");
    #endif
    GvEv(pMyDisasm);
    FillFlags(pMyDisasm, 19);
  }
  else {
    failDecode(pMyDisasm);
  }
}